

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

void __thiscall
Am_Text_Fragment::Am_Text_Fragment
          (Am_Text_Fragment *this,Am_Rich_Text_Data *inTextObject,char *inString,
          Am_Text_Length inStrLen)

{
  Am_Text_Fragment *this_00;
  
  this->mType = 0x8008;
  this->mTextObject = inTextObject;
  this->mStrLen = inStrLen;
  this->mStartIndex = 0;
  this->mNext = (Am_Text_Fragment *)0x0;
  this->mFirstMark = (Am_Text_Mark *)0x0;
  this->mPrev = (Am_Text_Fragment *)0x0;
  if (0x400 < inStrLen) {
    this->mStrLen = 0x400;
    memmove(this->mString,inString,0x400);
    this_00 = (Am_Text_Fragment *)operator_new(0x438);
    Am_Text_Fragment(this_00,inTextObject,(char *)(this + 1),inStrLen - 0x400);
    this->mNext = this_00;
    return;
  }
  this->mStrLen = inStrLen;
  memmove(this->mString,inString,inStrLen);
  return;
}

Assistant:

Am_Text_Fragment::Am_Text_Fragment(Am_Rich_Text_Data *inTextObject,
                                   const char *inString,
                                   Am_Text_Length inStrLen)
{
  mType = Am_STRING;
  mTextObject = inTextObject;
  mStrLen = inStrLen;
  mStartIndex = 0;
  mFirstMark = nullptr;
  mPrev = mNext = nullptr;

  if (inStrLen > kFragStrSize) {
    mStrLen = kFragStrSize;
    memmove(mString, inString, (int)mStrLen);
    mNext = new Am_Text_Fragment(inTextObject, mString + kFragStrSize,
                                 inStrLen - kFragStrSize);
  } else {
    mStrLen = inStrLen;
    memmove(mString, inString, (int)mStrLen);
  }
}